

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::ResolveLanguageCompiler
          (cmGlobalGenerator *this,string *lang,cmMakefile *mf,bool optional)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  undefined8 nameIn;
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  cmake *pcVar4;
  cmState *pcVar5;
  char *pcVar6;
  allocator local_1b9;
  string local_1b8;
  allocator local_191;
  string local_190;
  char *local_170;
  char *cvars;
  string pathString;
  string local_130;
  undefined1 local_110 [8];
  string cnameString;
  string changeVars;
  char *cname;
  pointer pbStack_c0;
  pointer local_b8;
  string local_a8;
  string local_88 [8];
  string path;
  char *name;
  allocator local_49;
  undefined1 local_48 [8];
  string langComp;
  bool optional_local;
  cmMakefile *mf_local;
  string *lang_local;
  cmGlobalGenerator *this_local;
  
  langComp.field_2._M_local_buf[0xf] = optional;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_48,"CMAKE_",&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::__cxx11::string::operator+=((string *)local_48,(string *)lang);
  std::__cxx11::string::operator+=((string *)local_48,"_COMPILER");
  pcVar2 = cmMakefile::GetDefinition(mf,(string *)local_48);
  if (pcVar2 == (char *)0x0) {
    if ((langComp.field_2._M_local_buf[0xf] & 1U) == 0) {
      pcVar2 = (char *)std::__cxx11::string::c_str();
      cmSystemTools::Error(pcVar2," not set, after EnableLanguage",(char *)0x0,(char *)0x0);
    }
    goto LAB_005c3a80;
  }
  path.field_2._8_8_ = cmMakefile::GetRequiredDefinition(mf,(string *)local_48);
  std::__cxx11::string::string(local_88);
  bVar1 = cmsys::SystemTools::FileIsFullPath((char *)path.field_2._8_8_);
  nameIn = path.field_2._8_8_;
  if (bVar1) {
    std::__cxx11::string::operator=(local_88,(char *)path.field_2._8_8_);
  }
  else {
    cname = (char *)0x0;
    pbStack_c0 = (pointer)0x0;
    local_b8 = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&cname);
    cmsys::SystemTools::FindProgram
              (&local_a8,(char *)nameIn,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&cname,false);
    std::__cxx11::string::operator=(local_88,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&cname);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmsys::SystemTools::FileExists(pcVar2);
    if (!bVar1) goto LAB_005c3636;
LAB_005c364f:
    pcVar4 = GetCMakeInstance(this);
    pcVar5 = cmake::GetState(pcVar4);
    pcVar2 = cmState::GetInitializedCacheValue(pcVar5,(string *)local_48);
    std::__cxx11::string::string((string *)(cnameString.field_2._M_local_buf + 8));
    if ((pcVar2 != (char *)0x0) && ((langComp.field_2._M_local_buf[0xf] & 1U) == 0)) {
      std::__cxx11::string::string((string *)local_110);
      bVar1 = cmsys::SystemTools::FileIsFullPath(pcVar2);
      if (bVar1) {
        std::__cxx11::string::operator=((string *)local_110,pcVar2);
      }
      else {
        pathString.field_2._8_8_ = 0;
        this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&pathString.field_2 + 8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(this_00);
        cmsys::SystemTools::FindProgram(&local_130,pcVar2,this_00,false);
        std::__cxx11::string::operator=((string *)local_110,(string *)&local_130);
        std::__cxx11::string::~string((string *)&local_130);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&pathString.field_2 + 8));
      }
      std::__cxx11::string::string((string *)&cvars,local_88);
      cmsys::SystemTools::ConvertToUnixSlashes((string *)local_110);
      cmsys::SystemTools::ConvertToUnixSlashes((string *)&cvars);
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_110,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &cvars);
      if (bVar1) {
        pcVar4 = GetCMakeInstance(this);
        pcVar5 = cmake::GetState(pcVar4);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_190,"__CMAKE_DELETE_CACHE_CHANGE_VARS_",&local_191);
        pcVar6 = cmState::GetGlobalProperty(pcVar5,&local_190);
        std::__cxx11::string::~string((string *)&local_190);
        std::allocator<char>::~allocator((allocator<char> *)&local_191);
        local_170 = pcVar6;
        if (pcVar6 != (char *)0x0) {
          std::__cxx11::string::operator+=((string *)(cnameString.field_2._M_local_buf + 8),pcVar6);
          std::__cxx11::string::operator+=((string *)(cnameString.field_2._M_local_buf + 8),";");
        }
        std::__cxx11::string::operator+=
                  ((string *)(cnameString.field_2._M_local_buf + 8),(string *)local_48);
        std::__cxx11::string::operator+=((string *)(cnameString.field_2._M_local_buf + 8),";");
        std::__cxx11::string::operator+=((string *)(cnameString.field_2._M_local_buf + 8),pcVar2);
        pcVar4 = GetCMakeInstance(this);
        pcVar5 = cmake::GetState(pcVar4);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_1b8,"__CMAKE_DELETE_CACHE_CHANGE_VARS_",&local_1b9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        cmState::SetGlobalProperty(pcVar5,&local_1b8,pcVar2);
        std::__cxx11::string::~string((string *)&local_1b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
      }
      std::__cxx11::string::~string((string *)&cvars);
      std::__cxx11::string::~string((string *)local_110);
    }
    std::__cxx11::string::~string((string *)(cnameString.field_2._M_local_buf + 8));
  }
  else {
LAB_005c3636:
    if ((langComp.field_2._M_local_buf[0xf] & 1U) != 0) goto LAB_005c364f;
  }
  std::__cxx11::string::~string(local_88);
LAB_005c3a80:
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void cmGlobalGenerator::ResolveLanguageCompiler(const std::string &lang,
                                                cmMakefile *mf,
                                                bool optional) const
{
  std::string langComp = "CMAKE_";
  langComp += lang;
  langComp += "_COMPILER";

  if(!mf->GetDefinition(langComp))
    {
    if(!optional)
      {
      cmSystemTools::Error(langComp.c_str(),
                           " not set, after EnableLanguage");
      }
    return;
    }
  const char* name = mf->GetRequiredDefinition(langComp);
  std::string path;
  if(!cmSystemTools::FileIsFullPath(name))
    {
    path = cmSystemTools::FindProgram(name);
    }
  else
    {
    path = name;
    }
  if((path.empty() || !cmSystemTools::FileExists(path.c_str()))
      && (optional==false))
    {
    return;
    }
  const char* cname = this->GetCMakeInstance()->
    GetState()->GetInitializedCacheValue(langComp);
  std::string changeVars;
  if(cname && !optional)
    {
    std::string cnameString;
    if(!cmSystemTools::FileIsFullPath(cname))
      {
      cnameString = cmSystemTools::FindProgram(cname);
      }
    else
      {
      cnameString = cname;
      }
    std::string pathString = path;
    // get rid of potentially multiple slashes:
    cmSystemTools::ConvertToUnixSlashes(cnameString);
    cmSystemTools::ConvertToUnixSlashes(pathString);
    if (cnameString != pathString)
      {
      const char* cvars =
        this->GetCMakeInstance()->GetState()->GetGlobalProperty(
          "__CMAKE_DELETE_CACHE_CHANGE_VARS_");
      if(cvars)
        {
        changeVars += cvars;
        changeVars += ";";
        }
      changeVars += langComp;
      changeVars += ";";
      changeVars += cname;
      this->GetCMakeInstance()->GetState()->SetGlobalProperty(
        "__CMAKE_DELETE_CACHE_CHANGE_VARS_",
        changeVars.c_str());
      }
    }
}